

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

complex<float>
TPZMatrix<std::complex<float>_>::ReturnNearestValue
          (complex<float> val,TPZVec<std::complex<float>_> *Vec,complex<float> tol)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  complex<float> cVar4;
  double *pdVar5;
  int64_t i;
  long lVar6;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  double local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_78 = in_XMM0_Da;
  fStack_74 = in_XMM0_Db;
  fStack_70 = in_XMM0_Dc;
  fStack_6c = in_XMM0_Dd;
  local_48 = in_XMM1_Da;
  uStack_44 = in_XMM1_Db;
  dVar2 = fabs((double)CONCAT44(in_XMM0_Db -
                                (float)((ulong)**(undefined8 **)(val._M_value + 8) >> 0x20),
                                in_XMM0_Da - (float)**(undefined8 **)(val._M_value + 8)));
  dVar3 = fabs((double)CONCAT44(uStack_44,local_48));
  if (SUB84(dVar3,0) <= SUB84(dVar2,0)) {
    cVar4._M_value = *(undefined8 *)(val._M_value + 8);
    local_80 = (double)CONCAT44(fStack_74 - (float)((ulong)*(undefined8 *)cVar4._M_value >> 0x20),
                                local_78 - (float)*(undefined8 *)cVar4._M_value);
  }
  else {
    local_80 = 6.63804021470087e-315;
    cVar4._M_value = *(undefined8 *)(val._M_value + 8);
  }
  local_58 = *(undefined8 *)cVar4._M_value;
  uStack_50 = 0;
  for (lVar6 = 1; lVar6 < *(long *)(val._M_value + 0x10); lVar6 = lVar6 + 1) {
    uVar1 = *(undefined8 *)(*(long *)(val._M_value + 8) + lVar6 * 8);
    local_38 = local_78 - (float)uVar1;
    fStack_34 = fStack_74 - (float)((ulong)uVar1 >> 0x20);
    fStack_30 = fStack_70 - 0.0;
    fStack_2c = fStack_6c - 0.0;
    local_60 = (double)CONCAT44(fStack_34,local_38);
    dVar2 = fabs((double)CONCAT44(fStack_34,local_38));
    dVar3 = fabs((double)CONCAT44(uStack_44,local_48));
    pdVar5 = &local_80;
    if (SUB84(dVar3,0) <= SUB84(dVar2,0)) {
      dVar2 = fabs((double)CONCAT44(fStack_34,local_38));
      dVar3 = fabs(local_80);
      if (SUB84(dVar2,0) < SUB84(dVar3,0)) {
        local_58 = *(undefined8 *)(*(long *)(val._M_value + 8) + lVar6 * 8);
        uStack_50 = 0;
        pdVar5 = &local_60;
      }
    }
    cVar4._M_value = (_ComplexT)*pdVar5;
    local_80 = (double)cVar4._M_value;
  }
  return (complex<float>)cVar4._M_value;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}